

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O3

bool __thiscall Transformed::intersect(Transformed *this,Ray *ray,Hit *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vec2f vVar9;
  int iVar10;
  vec3f vVar11;
  vec3f vVar12;
  vec3f vVar13;
  Hit iresult;
  Ray iray;
  undefined1 local_104 [12];
  vec3f vStack_f8;
  vec3f vStack_ec;
  float fStack_e0;
  float fStack_dc;
  float fStack_d8;
  undefined8 local_d4;
  undefined8 uStack_cc;
  float local_c4;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b4;
  float local_ac;
  mat4f local_a8;
  mat4f local_68;
  
  vVar11 = transformedPoint(&this->invTrans,&ray->origin);
  vVar12 = transformedDir(&this->invTrans,&ray->dir);
  local_ac = vVar12.z;
  local_b4 = vVar12._0_8_;
  local_104._0_4_ = 0.0;
  local_104._4_4_ = 0.0;
  stack0xffffffffffffff04 = 0;
  vStack_f8.y = 0.0;
  vStack_f8.z = 0.0;
  vStack_ec.x = 0.0;
  vStack_ec.y = 0.0;
  vStack_ec.z = 0.0;
  fStack_e0 = 0.0;
  fStack_dc = 0.0;
  fStack_d8 = 0.0;
  local_d4 = 0;
  uStack_cc = 0;
  local_c4 = 0.0;
  local_c0 = vVar11._0_8_;
  local_b8 = vVar11.z;
  iVar10 = (**this->inner->_vptr_Primitive)();
  if (SUB41(iVar10,0) != false) {
    vVar11 = transformedPoint(&this->trans,(vec3f *)local_104);
    local_68.data[0][0] = (this->invTrans).data[0][0];
    local_68.data[1][0] = (this->invTrans).data[0][1];
    local_68.data[2][0] = (this->invTrans).data[0][2];
    local_68.data[3][0] = (this->invTrans).data[0][3];
    local_68.data[0][1] = (this->invTrans).data[1][0];
    local_68.data[1][1] = (this->invTrans).data[1][1];
    local_68.data[2][1] = (this->invTrans).data[1][2];
    local_68.data[3][1] = (this->invTrans).data[1][3];
    local_68.data[0][2] = (this->invTrans).data[2][0];
    local_68.data[1][2] = (this->invTrans).data[2][1];
    local_68.data[2][2] = (this->invTrans).data[2][2];
    local_68.data[3][2] = (this->invTrans).data[2][3];
    local_68.data[0][3] = (this->invTrans).data[3][0];
    local_68.data[1][3] = (this->invTrans).data[3][1];
    local_68.data[2][3] = (this->invTrans).data[3][2];
    local_68.data[3][3] = (this->invTrans).data[3][3];
    vVar12 = transformedDir(&local_68,&vStack_f8);
    local_a8.data[0][0] = (this->invTrans).data[0][0];
    local_a8.data[1][0] = (this->invTrans).data[0][1];
    local_a8.data[2][0] = (this->invTrans).data[0][2];
    local_a8.data[3][0] = (this->invTrans).data[0][3];
    local_a8.data[0][1] = (this->invTrans).data[1][0];
    local_a8.data[1][1] = (this->invTrans).data[1][1];
    local_a8.data[2][1] = (this->invTrans).data[1][2];
    local_a8.data[3][1] = (this->invTrans).data[1][3];
    local_a8.data[0][2] = (this->invTrans).data[2][0];
    local_a8.data[1][2] = (this->invTrans).data[2][1];
    local_a8.data[2][2] = (this->invTrans).data[2][2];
    local_a8.data[3][2] = (this->invTrans).data[2][3];
    local_a8.data[0][3] = (this->invTrans).data[3][0];
    local_a8.data[1][3] = (this->invTrans).data[3][1];
    local_a8.data[2][3] = (this->invTrans).data[3][2];
    local_a8.data[3][3] = (this->invTrans).data[3][3];
    vVar13 = transformedDir(&local_a8,&vStack_ec);
    vVar9.y = fStack_dc;
    vVar9.x = fStack_e0;
    result->hit = true;
    (result->p).x = (float)(int)vVar11._0_8_;
    (result->p).y = (float)(int)((ulong)vVar11._0_8_ >> 0x20);
    (result->p).z = vVar11.z;
    (result->Ns).x = (float)(int)vVar12._0_8_;
    (result->Ns).y = (float)(int)((ulong)vVar12._0_8_ >> 0x20);
    (result->Ns).z = vVar12.z;
    (result->Ng).x = (float)(int)vVar13._0_8_;
    (result->Ng).y = (float)(int)((ulong)vVar13._0_8_ >> 0x20);
    (result->Ng).z = vVar13.z;
    result->uv = vVar9;
    (result->dpdu).x = 0.0;
    (result->dpdu).y = 0.0;
    *(undefined8 *)&(result->dpdu).z = 0;
    (result->dpdv).y = 0.0;
    (result->dpdv).z = 0.0;
    fVar1 = (this->trans).data[1][1];
    fVar2 = (this->trans).data[1][0];
    fVar3 = (this->trans).data[1][2];
    fVar4 = (this->trans).data[1][3];
    fVar5 = (this->trans).data[2][1];
    fVar6 = (this->trans).data[2][0];
    fVar7 = (this->trans).data[2][2];
    fVar8 = (this->trans).data[2][3];
    (result->dpdu).x =
         (this->trans).data[0][3] * 0.0 +
         local_d4._4_4_ * (this->trans).data[0][2] +
         fStack_d8 * (this->trans).data[0][0] + (this->trans).data[0][1] * (float)local_d4;
    (result->dpdu).y =
         fVar4 * 0.0 + local_d4._4_4_ * fVar3 + fStack_d8 * fVar2 + fVar1 * (float)local_d4;
    (result->dpdu).z =
         fVar8 * 0.0 + local_d4._4_4_ * fVar7 + fStack_d8 * fVar6 + (float)local_d4 * fVar5;
    fVar1 = (this->trans).data[1][1];
    fVar2 = (this->trans).data[1][0];
    fVar3 = (this->trans).data[1][2];
    fVar4 = (this->trans).data[1][3];
    fVar5 = (this->trans).data[2][1];
    fVar6 = (this->trans).data[2][0];
    fVar7 = (this->trans).data[2][2];
    fVar8 = (this->trans).data[2][3];
    (result->dpdv).x =
         (this->trans).data[0][3] * 0.0 +
         local_c4 * (this->trans).data[0][2] +
         (float)uStack_cc * (this->trans).data[0][0] + (this->trans).data[0][1] * uStack_cc._4_4_;
    (result->dpdv).y =
         fVar4 * 0.0 + local_c4 * fVar3 + (float)uStack_cc * fVar2 + fVar1 * uStack_cc._4_4_;
    (result->dpdv).z =
         fVar8 * 0.0 + local_c4 * fVar7 + (float)uStack_cc * fVar6 + uStack_cc._4_4_ * fVar5;
  }
  return SUB41(iVar10,0);
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		Ray iray(transformedPoint(invTrans, ray.origin), transformedDir(invTrans, ray.dir));
		Hit iresult;
		bool b = inner->intersect(iray, &iresult);
		if (!b) return false;
		*result = Hit(
			transformedPoint(trans, iresult.p),
			transformedDir(transposed(invTrans), iresult.Ns),
			transformedDir(transposed(invTrans), iresult.Ng),
			iresult.uv);
		result->dpdu = (trans * vec4f(iresult.dpdu, 0)).xyz();
		result->dpdv = (trans * vec4f(iresult.dpdv, 0)).xyz();
		return true;
	}